

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::anon_unknown_36::PromiseNetworkAddressHttpClient::openWebSocket
          (PromiseNetworkAddressHttpClient *this,StringPtr url,HttpHeaders *headers)

{
  NetworkAddressHttpClient *pNVar1;
  _func_int **pp_Var2;
  SourceLocation location;
  HttpClient HVar3;
  void *pvVar4;
  void *__child_stack;
  __fn *in_R8;
  __fn *__arg;
  ForkHub<kj::_::Void> *location_00;
  StringPtr url_00;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  String urlCopy;
  HttpHeaders headersCopy;
  ForkedPromise<void> local_170;
  code *local_160;
  Array<char> local_158;
  HttpClient local_138;
  undefined *local_130;
  undefined *puStack_128;
  undefined8 local_120;
  StringPtr *local_118;
  HttpHeaders *local_110;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_108;
  anon_class_128_3_9f8f6369_for_func local_100;
  HttpHeaders local_80;
  
  url_00.content.size_ = (StringPtr *)url.content.size_;
  pNVar1 = (((PromiseNetworkAddressHttpClient *)url.content.ptr)->client).ptr.ptr;
  local_118 = url_00.content.size_;
  local_110 = headers;
  if (pNVar1 == (NetworkAddressHttpClient *)0x0) {
    __arg = in_R8;
    str<kj::StringPtr&>((String *)&local_158,(kj *)&local_118,url_00.content.size_);
    HttpHeaders::clone(&local_80,in_R8,__child_stack,(int)headers,__arg);
    ForkedPromise<void>::addBranch(&local_170);
    local_100.url.content.ptr = local_158.ptr;
    local_100.url.content.size_ = local_158.size_;
    local_100.url.content.disposer = local_158.disposer;
    local_158.ptr = (char *)0x0;
    local_158.size_ = 0;
    local_100.this = (PromiseNetworkAddressHttpClient *)url.content.ptr;
    HttpHeaders::HttpHeaders(&local_100.headers,&local_80);
    local_160 = kj::_::
                SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6241:11)>
                ::anon_class_128_3_9f8f6369_for_func::operator();
    pp_Var2 = local_170.hub.disposer[1]._vptr_Disposer;
    if (pp_Var2 == (_func_int **)0x0 || (ulong)((long)local_170.hub.disposer - (long)pp_Var2) < 0xa0
       ) {
      pvVar4 = operator_new(0x400);
      location_00 = (ForkHub<kj::_::Void> *)((long)pvVar4 + 0x360);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::_lambda()_1_,void*&>
                ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6241:11)>
                  *)location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_170,
                 &local_100,&local_160);
      *(void **)((long)pvVar4 + 0x368) = pvVar4;
    }
    else {
      local_170.hub.disposer[1]._vptr_Disposer = (_func_int **)0x0;
      location_00 = (ForkHub<kj::_::Void> *)(local_170.hub.disposer + -0x14);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::_lambda()_1_,void*&>
                ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6241:11)>
                  *)location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_170,
                 &local_100,&local_160);
      local_170.hub.disposer[-0x13]._vptr_Disposer = pp_Var2;
    }
    local_130 = &DAT_003d3151;
    puStack_128 = &DAT_003d31b0;
    local_120 = 0x4c0000058b;
    location.function = &DAT_003d31b0;
    location.fileName = &DAT_003d3151;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    local_170.hub.ptr = location_00;
    kj::_::maybeChain<kj::HttpClient::WebSocketResponse>
              ((OwnPromiseNode *)&local_138,
               (Promise<kj::HttpClient::WebSocketResponse> *)&local_170.hub.ptr,location);
    HVar3._vptr_HttpClient = local_138._vptr_HttpClient;
    local_138._vptr_HttpClient = (_func_int **)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_138);
    (this->super_HttpClient)._vptr_HttpClient = HVar3._vptr_HttpClient;
    local_108.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_108);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_170.hub.ptr);
    (anonymous_namespace)::PromiseNetworkAddressHttpClient::
    openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::{lambda()#1}::~HttpHeaders
              ((_lambda___1_ *)&local_100);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_170);
    HttpHeaders::~HttpHeaders(&local_80);
    Array<char>::~Array(&local_158);
  }
  else {
    url_00.content.ptr = (char *)pNVar1;
    NetworkAddressHttpClient::openWebSocket((NetworkAddressHttpClient *)this,url_00,headers);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<WebSocketResponse> openWebSocket(
      kj::StringPtr url, const HttpHeaders& headers) override {
    KJ_IF_SOME(c, client) {
      return c->openWebSocket(url, headers);
    } else {
      auto urlCopy = kj::str(url);
      auto headersCopy = headers.clone();
      return promise.addBranch().then(
          [this,url=kj::mv(urlCopy),headers=kj::mv(headersCopy)]() {
        return KJ_ASSERT_NONNULL(client)->openWebSocket(url, headers);
      });
    }